

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O3

int Acec_MatchCountCommon(Vec_Wec_t *vLits1,Vec_Wec_t *vLits2,int Shift)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  int *piVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int *pBeg2;
  int *piVar8;
  long lVar9;
  int *piVar10;
  long lVar11;
  int *pBeg1;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  piVar4 = (int *)malloc(400);
  p->pArray = piVar4;
  iVar5 = vLits1->nSize;
  if (iVar5 < 1) {
    iVar7 = 0;
  }
  else {
    lVar11 = 0;
    iVar7 = 0;
    do {
      lVar6 = lVar11 + Shift;
      if ((-1 < lVar6) && (lVar6 < vLits2->nSize)) {
        lVar9 = (long)vLits1->pArray[lVar11].nSize;
        piVar4 = vLits1->pArray[lVar11].pArray;
        iVar2 = vLits2->pArray[lVar6].nSize;
        piVar8 = vLits2->pArray[lVar6].pArray;
        p->nSize = 0;
        iVar3 = 0;
        if ((0 < lVar9) && (iVar3 = 0, 0 < iVar2)) {
          piVar1 = piVar4 + lVar9;
          piVar10 = piVar8 + iVar2;
          do {
            iVar5 = *piVar4;
            if (iVar5 == *piVar8) {
              Vec_IntPush(p,iVar5);
              piVar4 = piVar4 + 1;
LAB_0066ae83:
              piVar8 = piVar8 + 1;
            }
            else {
              if (iVar5 <= *piVar8) goto LAB_0066ae83;
              piVar4 = piVar4 + 1;
            }
          } while ((piVar4 < piVar1) && (piVar8 < piVar10));
          iVar3 = p->nSize;
          iVar5 = vLits1->nSize;
        }
        iVar7 = iVar7 + iVar3;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar5);
    piVar4 = p->pArray;
  }
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(p);
  return iVar7;
}

Assistant:

int Acec_MatchCountCommon( Vec_Wec_t * vLits1, Vec_Wec_t * vLits2, int Shift )
{
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Vec_Int_t * vLevel1, * vLevel2; 
    int i, nCommon = 0;
    Vec_WecForEachLevel( vLits1, vLevel1, i )
    {
        if ( i+Shift < 0 || i+Shift >= Vec_WecSize(vLits2) )
            continue;
        vLevel2 = Vec_WecEntry( vLits2, i+Shift );
        nCommon += Vec_IntTwoFindCommonReverse( vLevel1, vLevel2, vRes );
    }
    Vec_IntFree( vRes );
    return nCommon;
}